

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O3

void __thiscall
kj::anon_unknown_36::WrappableStreamMixin<kj::(anonymous_namespace)::HttpInputStreamImpl>::
~WrappableStreamMixin(WrappableStreamMixin<kj::(anonymous_namespace)::HttpInputStreamImpl> *this)

{
  char *pcVar1;
  size_t sVar2;
  String local_28;
  
  if (this != (WrappableStreamMixin<kj::(anonymous_namespace)::HttpInputStreamImpl> *)0x0) {
    if (kj::_::Debug::minSeverity < 3) {
      getStackTrace();
      kj::_::Debug::log<char_const(&)[62],kj::String>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
                 ,0x515,ERROR,
                 "\"HTTP connection destroyed while HTTP body streams still exist\", kj::getStackTrace()"
                 ,(char (*) [62])"HTTP connection destroyed while HTTP body streams still exist",
                 &local_28);
      sVar2 = local_28.content.size_;
      pcVar1 = local_28.content.ptr;
      if (local_28.content.ptr != (char *)0x0) {
        local_28.content.ptr = (char *)0x0;
        local_28.content.size_ = 0;
        (**(local_28.content.disposer)->_vptr_ArrayDisposer)
                  (local_28.content.disposer,pcVar1,1,sVar2,sVar2,0);
      }
    }
    (this->currentWrapper).ptr = (Maybe<kj::(anonymous_namespace)::HttpInputStreamImpl_&> *)0x0;
  }
  return;
}

Assistant:

~WrappableStreamMixin() noexcept(false) {
    KJ_IF_SOME(w, currentWrapper) {
      KJ_LOG(ERROR, "HTTP connection destroyed while HTTP body streams still exist",
          kj::getStackTrace());
      w = kj::none;
    }
  }